

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t sysbvm_type_createAnonymousAndMetatype(sysbvm_context_t *context)

{
  sysbvm_tuple_t type;
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_type_tuple_t *result;
  sysbvm_tuple_t metatype;
  sysbvm_context_t *context_local;
  
  type = sysbvm_type_createAnonymousMetatype(context);
  psVar1 = sysbvm_context_allocatePointerTuple(context,type,0x1d);
  psVar1[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).anyValueType;
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[3].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[4].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[4].header.identityHashAndFlags = (int)sVar2;
  psVar1[4].header.objectSize = (int)(sVar2 >> 0x20);
  *(sysbvm_object_tuple_t **)(type + 0xf8) = psVar1;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousAndMetatype(sysbvm_context_t *context)
{
    sysbvm_tuple_t metatype = sysbvm_type_createAnonymousMetatype(context);
    sysbvm_type_tuple_t* result = (sysbvm_type_tuple_t*)sysbvm_context_allocatePointerTuple(context, metatype, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_type_tuple_t));
    result->supertype = context->roots.anyValueType;
    result->totalSlotCount = sysbvm_tuple_size_encode(context, 0);
    result->instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    ((sysbvm_metatype_t*)metatype)->thisType = (sysbvm_tuple_t)result;
    return (sysbvm_tuple_t)result;
}